

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_erase_result_t *
art_erase_at(art_erase_result_t *__return_storage_ptr__,art_t *art,art_ref_t ref,
            art_key_chunk_t *key,uint8_t depth)

{
  byte bVar1;
  art_key_chunk_t key_chunk;
  art_node_t *paVar2;
  uint8_t offset;
  art_ref_t aVar3;
  byte bVar4;
  ulong uVar5;
  art_inner_node_t *paVar6;
  ulong uVar7;
  long lVar8;
  art_typecode_t typecode;
  art_erase_result_t child_result;
  art_erase_result_t local_48;
  
  __return_storage_ptr__->rootmost_node = 0;
  typecode = (art_typecode_t)ref;
  uVar5 = ref & 0xff;
  uVar7 = (ulong)(uint)((int)uVar5 * 8);
  lVar8 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar7);
  __return_storage_ptr__->erased = false;
  paVar6 = (art_inner_node_t *)(*(long *)((long)art->nodes + uVar7) + lVar8);
  if (uVar5 == 1) {
    lVar8 = 0;
    do {
      if (paVar6->prefix[lVar8 + -1] != key[lVar8]) goto LAB_00106f26;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    lVar8 = 6;
LAB_00106f26:
    if ((char)lVar8 == '\x06') {
      __return_storage_ptr__->erased = true;
      __return_storage_ptr__->value_erased = *(art_val_t *)(paVar6[1].prefix + 1);
      paVar2 = art->nodes[1];
      *(uint64_t *)paVar6 = art->first_free[1];
      art->first_free[1] = (long)paVar6 - (long)paVar2 >> 4;
    }
  }
  else {
    bVar1 = paVar6->prefix_size;
    bVar4 = bVar1;
    if ((byte)(6 - depth) < bVar1) {
      bVar4 = 6 - depth;
    }
    if (bVar4 == 0) {
      bVar4 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (paVar6->prefix[uVar7] != key[(uint)depth + (int)uVar7]) {
          bVar4 = (byte)uVar7;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (bVar4 != uVar7);
    }
    if (bVar4 == bVar1) {
      key_chunk = key[(ulong)depth + (ulong)bVar4];
      aVar3 = art_find_child(paVar6,typecode,key_chunk);
      if ((aVar3 != 0) &&
         (art_erase_at(&local_48,art,aVar3,key,(char)((ulong)depth + (ulong)bVar4) + '\x01'),
         local_48.erased == true)) {
        __return_storage_ptr__->erased = true;
        __return_storage_ptr__->value_erased = local_48.value_erased;
        __return_storage_ptr__->rootmost_node = ref;
        paVar6 = (art_inner_node_t *)(lVar8 + (long)art->nodes[uVar5]);
        if (local_48.rootmost_node == 0) {
          aVar3 = art_node_erase(art,paVar6,typecode,key_chunk);
          __return_storage_ptr__->rootmost_node = aVar3;
        }
        else if (local_48.rootmost_node != aVar3) {
          art_replace(paVar6,typecode,key_chunk,local_48.rootmost_node);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static art_erase_result_t art_erase_at(art_t *art, art_ref_t ref,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = CROARING_ART_NULL_REF;
    result.erased = false;

    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.erased = true;
        result.value_erased = leaf->val;
        art_node_free(art, (art_node_t *)leaf, CROARING_ART_LEAF_TYPE);
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_ref_t child =
        art_find_child(inner_node, art_ref_typecode(ref), key_chunk);
    if (child == CROARING_ART_NULL_REF) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with
    // the child in the node.
    art_erase_result_t child_result =
        art_erase_at(art, child, key, depth + common_prefix + 1);
    if (!child_result.erased) {
        return result;
    }
    result.erased = true;
    result.value_erased = child_result.value_erased;
    result.rootmost_node = ref;

    // Deref again as nodes may have changed location.
    inner_node = (art_inner_node_t *)art_deref(art, ref);
    if (child_result.rootmost_node == CROARING_ART_NULL_REF) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node =
            art_node_erase(art, inner_node, art_ref_typecode(ref), key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, art_ref_typecode(ref), key_chunk,
                    child_result.rootmost_node);
    }
    return result;
}